

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb__reg_parse(stb_matcher *matcher,int start,char *regex,stb_uint16 *end)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  int i;
  uint to;
  int iVar6;
  int iVar7;
  stb_uint32 *__s;
  long lVar8;
  uint uVar9;
  byte *pbVar10;
  int iVar11;
  int iVar12;
  uint from;
  stb_uint16 last_end;
  stb_uint16 *local_148;
  int k [2];
  stb_uint8 flags [256];
  
  last_end = (stb_uint16)start;
  uVar9 = 0xffffffff;
  local_148 = end;
LAB_0015ac6c:
  to = (uint)last_end;
  pbVar10 = (byte *)regex;
LAB_0015ac72:
  uVar5 = last_end;
  regex = (char *)(pbVar10 + 1);
  bVar2 = *pbVar10;
  switch(bVar2) {
  case 0x24:
    goto switchD_0015ac88_caseD_24;
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2c:
  case 0x2d:
switchD_0015ac88_caseD_25:
    regex = (char *)pbVar10;
LAB_0015ae50:
    iVar7 = stb__add_node(matcher);
    uVar5 = last_end;
    stb__add_edge(matcher,(uint)last_end,iVar7,(int)*regex);
    last_end = (stb_uint16)iVar7;
    break;
  case 0x28:
    regex = stb__reg_parse_alt(matcher,(uint)last_end,regex,&last_end);
    if ((byte *)regex == (byte *)0x0) {
      return (char *)0x0;
    }
    if (*regex != 0x29) {
      return (char *)0x0;
    }
    break;
  case 0x29:
switchD_0015ac88_caseD_29:
    *local_148 = last_end;
    return (char *)pbVar10;
  case 0x2a:
    if ((int)uVar9 < 0) {
      return (char *)0x0;
    }
    stb__add_epsilon(matcher,uVar9,to & 0xffff);
    goto LAB_0015acce;
  case 0x2b:
    if ((int)uVar9 < 0) {
      return (char *)0x0;
    }
LAB_0015acce:
    from = to & 0xffff;
    stb__add_epsilon(matcher,from,uVar9);
    to = stb__add_node(matcher);
    stb__add_epsilon(matcher,from,to);
    last_end = (stb_uint16)to;
    pbVar10 = (byte *)regex;
    goto LAB_0015ac72;
  case 0x2e:
    iVar6 = stb__add_node(matcher);
    iVar7 = -1;
    goto LAB_0015ad66;
  default:
    if (bVar2 == 0x3f) goto code_r0x0015acaa;
    if (bVar2 == 0) goto switchD_0015ac88_caseD_29;
    if (bVar2 != 0x5b) {
      if (bVar2 != 0x5c) {
        if (bVar2 == 0x7b) {
          return (char *)0x0;
        }
        if (bVar2 == 0x7c) goto switchD_0015ac88_caseD_29;
        goto switchD_0015ac88_caseD_25;
      }
      if (*regex == 0) {
        return (char *)0x0;
      }
      goto LAB_0015ae50;
    }
    if (matcher->num_charset == 0) {
      __s = (stb_uint32 *)stb_malloc(matcher,0x400);
      matcher->charset = __s;
      memset(__s,0,0x400);
    }
    memset(flags,0,0x100);
    bVar2 = *regex;
    pbVar10 = pbVar10 + 2;
    if (bVar2 != 0x5e) {
      pbVar10 = (byte *)regex;
    }
    if (*pbVar10 == 0x5d) {
      flags[0x5d] = '\x01';
      pbVar10 = pbVar10 + 1;
    }
    goto LAB_0015adfc;
  }
  uVar9 = (uint)uVar5;
  regex = (char *)((byte *)regex + 1);
  goto LAB_0015ac6c;
code_r0x0015acaa:
  if ((int)uVar9 < 0) {
    return (char *)0x0;
  }
  stb__add_epsilon(matcher,uVar9,to & 0xffff);
  pbVar10 = (byte *)regex;
  goto LAB_0015ac72;
LAB_0015adfc:
  bVar3 = *pbVar10;
  if (bVar3 == 0) {
    return (char *)0x0;
  }
  if (bVar3 != 0x5d) {
    uVar9 = (uint)(char)bVar3;
    if (pbVar10[1] == 0x2d) {
      bVar4 = pbVar10[2];
      if ((int)(char)bVar4 == 0x5d) goto LAB_0015ae1f;
      if (bVar4 < bVar3) {
        return (char *)0x0;
      }
      pbVar10 = pbVar10 + 3;
      for (; uVar9 <= (uint)(int)(char)bVar4; uVar9 = uVar9 + 1) {
        flags[uVar9] = '\x01';
      }
    }
    else {
LAB_0015ae1f:
      pbVar10 = pbVar10 + 1;
      flags[uVar9] = '\x01';
    }
    goto LAB_0015adfc;
  }
  if (bVar2 == 0x5e) {
    for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
      flags[lVar8] = '\x01' - flags[lVar8];
    }
  }
  regex = (char *)(pbVar10 + 1);
  iVar7 = matcher->num_charset;
  iVar6 = 0;
  iVar11 = 0;
  if (0 < iVar7) {
    iVar6 = iVar7;
    iVar11 = 0;
  }
  for (; iVar12 = iVar6, iVar11 != iVar6; iVar11 = iVar11 + 1) {
    k[0] = 0;
    k[1] = 1 << ((byte)iVar11 & 0x1f);
    lVar8 = 0;
    do {
      iVar12 = iVar11;
      if (lVar8 == 0x100) goto LAB_0015aef2;
      pbVar10 = flags + lVar8;
      puVar1 = matcher->charset + lVar8;
      lVar8 = lVar8 + 1;
    } while ((*puVar1 & k[1]) == k[*pbVar10]);
  }
LAB_0015aef2:
  if (iVar12 == iVar7) {
    matcher->num_charset = iVar7 + 1;
    if (0x1f < iVar7) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x2429,"char *stb__reg_parse(stb_matcher *, int, char *, stb_uint16 *)");
    }
    for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
      if (flags[lVar8] != '\0') {
        matcher->charset[lVar8] = matcher->charset[lVar8] | 1 << ((byte)iVar7 & 0x1f);
      }
    }
  }
  iVar7 = stb__add_node(matcher);
  uVar9 = (uint)last_end;
  stb__add_edge(matcher,(uint)last_end,iVar7,-2 - iVar12);
  last_end = (stb_uint16)iVar7;
  goto LAB_0015ac6c;
switchD_0015ac88_caseD_24:
  iVar6 = stb__add_node(matcher);
  iVar7 = 10;
LAB_0015ad66:
  uVar9 = (uint)last_end;
  stb__add_edge(matcher,(uint)last_end,iVar6,iVar7);
  last_end = (stb_uint16)iVar6;
  goto LAB_0015ac6c;
}

Assistant:

static char *stb__reg_parse(stb_matcher *matcher, int start, char *regex, stb_uint16 *end)
{
   int n;
   int last_start = -1;
   stb_uint16 last_end = start;

   while (*regex) {
      switch (*regex) {
         case '(':
            last_start = last_end;
            regex = stb__reg_parse_alt(matcher, last_end, regex+1, &last_end);
            if (regex == NULL || *regex != ')')
               return NULL;
            ++regex;
            break;

         case '|':
         case ')':
            *end = last_end;
            return regex;

         case '?':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_start, last_end);
            ++regex;
            break;

         case '*':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_start, last_end);

            // fall through

         case '+':
            if (last_start < 0) return NULL;
            stb__add_epsilon(matcher, last_end, last_start);
            // prevent links back to last_end from chaining to last_start
            n = stb__add_node(matcher);
            stb__add_epsilon(matcher, last_end, n);
            last_end = n;
            ++regex;
            break;

         case '{':   // not supported!
            // @TODO: given {n,m}, clone last_start to last_end m times,
            // and include epsilons from start to first m-n blocks
            return NULL; 

         case '\\':
            ++regex;
            if (!*regex) return NULL;

            // fallthrough
         default: // match exactly this character
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, *regex);
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '$':
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, '\n');
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '.':
            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, -1);
            last_start = last_end;
            last_end = n;
            ++regex;
            break;

         case '[': {
            stb_uint8 flags[256];
            int invert = 0,z;
            ++regex;
            if (matcher->num_charset == 0) {
               matcher->charset = (stb_uint *) stb_malloc(matcher, sizeof(*matcher->charset) * 256);
               memset(matcher->charset, 0, sizeof(*matcher->charset) * 256);
            }

            memset(flags,0,sizeof(flags));

            // leading ^ is special
            if (*regex == '^')
               ++regex, invert = 1;

            // leading ] is special
            if (*regex == ']') {
               flags[']'] = 1;
               ++regex;
            }
            while (*regex != ']') {
               stb_uint a;
               if (!*regex) return NULL;
               a = *regex++;
               if (regex[0] == '-' && regex[1] != ']') {
                  stb_uint i,b = regex[1];
                  regex += 2;
                  if (b == 0) return NULL;
                  if (a > b) return NULL;
                  for (i=a; i <= b; ++i)
                     flags[i] = 1;
               } else
                  flags[a] = 1;
            }
            ++regex;
            if (invert) {
               int i;
               for (i=0; i < 256; ++i)
                  flags[i] = 1-flags[i];
            }

            // now check if any existing charset matches
            for (z=0; z < matcher->num_charset; ++z) {
               int i, k[2] = { 0, 1 << z};
               for (i=0; i < 256; ++i) {
                  unsigned int f = k[flags[i]];
                  if ((matcher->charset[i] & k[1]) != f)
                     break;
               }
               if (i == 256) break;
            }

            if (z == matcher->num_charset) {
               int i;
               ++matcher->num_charset;
               if (matcher->num_charset > 32) {
                  assert(0); /* NOTREACHED */
                  return NULL; // too many charsets, oops
               }
               for (i=0; i < 256; ++i)
                  if (flags[i])
                     matcher->charset[i] |= (1 << z);
            }

            n = stb__add_node(matcher);
            stb__add_edge(matcher, last_end, n, -2 - z);
            last_start = last_end;
            last_end = n;
            break;
         }
      }
   }
   *end = last_end;
   return regex;
}